

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_parser.hpp
# Opt level: O0

void __thiscall
jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>>::
basic_cbor_parser<jsoncons::stream_source<unsigned_char>>
          (basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *this,
          stream_source<unsigned_char> *source,cbor_decode_options *options,allocator<char> *alloc)

{
  allocator *in_RCX;
  ser_context *in_RDI;
  stream_source<unsigned_char> *in_stack_00000118;
  stream_source<unsigned_char> *in_stack_00000120;
  allocator_type *in_stack_ffffffffffffff48;
  allocator *this_00;
  ser_context *__args;
  vector<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_> *this_01;
  
  ser_context::ser_context(in_RDI);
  in_RDI->_vptr_ser_context = (_func_int **)&PTR__basic_cbor_parser_01336af8;
  *(undefined1 *)&in_RDI[1]._vptr_ser_context = 1;
  *(undefined1 *)((long)&in_RDI[1]._vptr_ser_context + 1) = 0;
  *(undefined1 *)((long)&in_RDI[1]._vptr_ser_context + 2) = 0;
  *(undefined4 *)((long)&in_RDI[1]._vptr_ser_context + 4) = 0;
  in_RDI[2]._vptr_ser_context = (_func_int **)0x0;
  *(undefined4 *)&in_RDI[3]._vptr_ser_context = 0;
  std::bitset<3UL>::bitset((bitset<3UL> *)0x2decf3);
  this_00 = (allocator *)(in_RDI + 5);
  std::allocator<char>::allocator(this_00);
  __args = in_RDI + 6;
  stream_source<unsigned_char>::stream_source(in_stack_00000120,in_stack_00000118);
  this_01 = (vector<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_> *)
            (in_RDI + 0x39);
  cbor_decode_options::cbor_decode_options
            ((cbor_decode_options *)this_00,(cbor_decode_options *)in_stack_ffffffffffffff48);
  std::__cxx11::string::string((string *)(in_RDI + 0x3c),in_RCX);
  std::allocator<unsigned_char>::allocator<char>
            ((allocator<unsigned_char> *)this_00,(allocator<char> *)in_stack_ffffffffffffff48);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00,
             (allocator_type *)in_stack_ffffffffffffff48);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x2deda8);
  std::allocator<jsoncons::cbor::parse_state>::allocator<char>
            ((allocator<jsoncons::cbor::parse_state> *)this_00,
             (allocator<char> *)in_stack_ffffffffffffff48);
  std::vector<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>::vector
            ((vector<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_> *)
             this_00,(allocator_type *)in_stack_ffffffffffffff48);
  std::allocator<jsoncons::cbor::parse_state>::~allocator
            ((allocator<jsoncons::cbor::parse_state> *)0x2dedeb);
  std::allocator<unsigned_char>::allocator<char>
            ((allocator<unsigned_char> *)this_00,(allocator<char> *)in_stack_ffffffffffffff48);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00,
             (allocator_type *)in_stack_ffffffffffffff48);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x2dee2e);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x2dee44);
  std::
  allocator<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string>_>_>
  ::allocator<char>((allocator<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string>_>_>
                     *)this_00,(allocator<char> *)in_stack_ffffffffffffff48);
  std::
  vector<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string>_>,_std::allocator<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string>_>_>_>
  ::vector((vector<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string>_>,_std::allocator<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string>_>_>_>
            *)this_00,in_stack_ffffffffffffff48);
  std::
  allocator<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string>_>_>
  ::~allocator((allocator<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string>_>_>
                *)0x2dee87);
  std::vector<jsoncons::cbor::parse_state,std::allocator<jsoncons::cbor::parse_state>>::
  emplace_back<jsoncons::cbor::parse_mode,int>(this_01,(parse_mode *)__args,(int *)this_00);
  return;
}

Assistant:

basic_cbor_parser(Sourceable&& source,
                      const cbor_decode_options& options = cbor_decode_options(),
                      const Allocator& alloc = Allocator())
       : alloc_(alloc),
         source_(std::forward<Sourceable>(source)),
         options_(options),
         text_buffer_(alloc),
         bytes_buffer_(alloc),
         state_stack_(alloc),
         typed_array_(alloc),
         stringref_map_stack_(alloc)
    {
        state_stack_.emplace_back(parse_mode::root,0);
    }